

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSource.hpp
# Opt level: O1

void __thiscall
Outputs::Speaker::SampleSource<GI::AY38910::AY38910<false>,_false,_4>::
apply_samples<(Outputs::Speaker::Action)1>
          (SampleSource<GI::AY38910::AY38910<false>,_false,_4> *this,size_t number_of_samples,
          type *target)

{
  AY38910SampleSource<false> *this_00;
  int iVar1;
  int iVar2;
  type tVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  type *ptVar7;
  ulong uVar8;
  
  this_00 = (AY38910SampleSource<false> *)(this + -0x454);
  tVar3 = GI::AY38910::AY38910SampleSource<false>::level(this_00);
  iVar1 = this->master_divider_;
  if (iVar1 == 4 || number_of_samples == 0) {
    uVar8 = 0;
  }
  else {
    uVar6 = 0;
    do {
      target[uVar6] = target[uVar6] + tVar3;
      uVar8 = uVar6 + 1;
      if (number_of_samples <= uVar8) break;
      iVar2 = (int)uVar6;
      uVar6 = uVar8;
    } while (iVar1 + iVar2 != 3);
    this->master_divider_ = iVar1 + (int)uVar8;
  }
  GI::AY38910::AY38910SampleSource<false>::advance(this_00);
  uVar6 = number_of_samples - uVar8 >> 2;
  if ((int)uVar6 != 0) {
    ptVar7 = target + uVar8;
    do {
      uVar8 = uVar8 + 4;
      tVar3 = GI::AY38910::AY38910SampleSource<false>::level(this_00);
      lVar4 = 0;
      do {
        *(short *)((long)ptVar7 + lVar4) = *(short *)((long)ptVar7 + lVar4) + tVar3;
        lVar4 = lVar4 + 2;
      } while (lVar4 != 8);
      GI::AY38910::AY38910SampleSource<false>::advance(this_00);
      ptVar7 = ptVar7 + 4;
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  GI::AY38910::AY38910SampleSource<false>::level(this_00);
  this->master_divider_ = (int)number_of_samples - (int)uVar8;
  tVar3 = GI::AY38910::AY38910SampleSource<false>::level(this_00);
  if (number_of_samples != uVar8) {
    lVar4 = uVar8 * 2;
    do {
      *(short *)((long)target + lVar4) = *(short *)((long)target + lVar4) + tVar3;
      lVar4 = lVar4 + 2;
    } while (number_of_samples * 2 != lVar4);
  }
  return;
}

Assistant:

void apply_samples(std::size_t number_of_samples, typename SampleT<stereo>::type *target) {
			auto &source = *static_cast<SourceT *>(this);

			if constexpr (divider == 1) {
				while(number_of_samples--) {
					apply<action>(*target, source.level());
					++target;
					source.advance();
				}
			} else {
				std::size_t c = 0;

				// Fill in the tail of any partially-captured level.
				auto level = source.level();
				while(c < number_of_samples && master_divider_ != divider) {
					apply<action>(target[c], level);
					++c;
					++master_divider_;
				}
				source.advance();

				// Provide all full levels.
				auto whole_steps = static_cast<int>((number_of_samples - c) / divider);
				while(whole_steps--) {
					fill<action>(&target[c], &target[c + divider], source.level());
					c += divider;
					source.advance();
				}

				// Provide the head of a further partial capture.
				level = source.level();
				master_divider_ = static_cast<int>(number_of_samples - c);
				fill<action>(&target[c], &target[number_of_samples], source.level());
			}
		}